

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# c_runtime_api.cc
# Opt level: O0

int TVMModLoadFromFile(char *file_name,char *format,TVMModuleHandle *out)

{
  Module *this;
  runtime_error *_except_;
  string local_90;
  allocator<char> local_59;
  string local_58;
  undefined1 local_38 [8];
  Module m;
  TVMModuleHandle *out_local;
  char *format_local;
  char *file_name_local;
  
  m.node_.super___shared_ptr<tvm::runtime::ModuleNode,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
       = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)out;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_58,file_name,&local_59);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_90,format,(allocator<char> *)((long)&_except_ + 7));
  tvm::runtime::Module::LoadFromFile((Module *)local_38,&local_58,&local_90);
  std::__cxx11::string::~string((string *)&local_90);
  std::allocator<char>::~allocator((allocator<char> *)((long)&_except_ + 7));
  std::__cxx11::string::~string((string *)&local_58);
  std::allocator<char>::~allocator(&local_59);
  this = (Module *)operator_new(0x10);
  tvm::runtime::Module::Module(this,(Module *)local_38);
  (m.node_.super___shared_ptr<tvm::runtime::ModuleNode,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi)->_vptr__Sp_counted_base = (_func_int **)this;
  tvm::runtime::Module::~Module((Module *)local_38);
  return 0;
}

Assistant:

int TVMModLoadFromFile(const char *file_name,
                       const char *format,
                       TVMModuleHandle *out) {
  API_BEGIN();
  Module m = Module::LoadFromFile(file_name, format);
  *out = new Module(m);
  API_END();
}